

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  int iVar3;
  bool local_29;
  uint local_20;
  int oldnny;
  int status;
  int nargs_local;
  lua_State *from_local;
  lua_State *L_local;
  
  uVar1 = L->nny;
  if (from == (lua_State *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = from->nCcalls + 1;
  }
  L->nCcalls = uVar2;
  L->nny = 0;
  local_20 = luaD_rawrunprotected(L,resume,L->top + -(long)nargs);
  if (local_20 == 0xffffffff) {
    local_20 = 2;
  }
  else {
    while (local_29 = 1 < local_20, local_29) {
      iVar3 = recover(L,local_20);
      if (iVar3 == 0) {
        L->status = (lu_byte)local_20;
        seterrorobj(L,local_20,L->top);
        L->ci->top = L->top;
        break;
      }
      local_20 = luaD_rawrunprotected(L,unroll,(void *)0x0);
    }
  }
  L->nny = uVar1;
  L->nCcalls = L->nCcalls - 1;
  return local_20;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs) {
  int status;
  int oldnny = L->nny;  /* save 'nny' */
  lua_lock(L);
  luai_userstateresume(L, nargs);
  L->nCcalls = (from) ? from->nCcalls + 1 : 1;
  L->nny = 0;  /* allow yields */
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, L->top - nargs);
  if (status == -1)  /* error calling 'lua_resume'? */
    status = LUA_ERRRUN;
  else {  /* yield or regular error */
    while (status != LUA_OK && status != LUA_YIELD) {  /* error? */
      if (recover(L, status))  /* recover point? */
        status = luaD_rawrunprotected(L, unroll, NULL);  /* run continuation */
      else {  /* unrecoverable error */
        L->status = cast_byte(status);  /* mark thread as `dead' */
        seterrorobj(L, status, L->top);
        L->ci->top = L->top;
        break;
      }
    }
    lua_assert(status == L->status);
  }
  L->nny = oldnny;  /* restore 'nny' */
  L->nCcalls--;
  lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
  lua_unlock(L);
  return status;
}